

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  Content *pCVar1;
  ushort uVar2;
  State SVar3;
  Impl *pIVar4;
  CompiledModule *params_1;
  Node **ppNVar5;
  Maybe<capnp::schema::Node::Reader> *pMVar6;
  int iVar7;
  NodeTranslator *pNVar8;
  Schema SVar9;
  undefined1 *ptr;
  Node *pNVar10;
  int in_EDX;
  long lVar11;
  Node **ppNVar12;
  char c;
  undefined4 in_register_00000034;
  Node *params;
  char *pcVar13;
  SchemaLoader *this_00;
  Reader *auxNode;
  Arena *pAVar14;
  ArrayPtr<const_char> AVar15;
  Reader value;
  StringPtr error;
  StringPtr error_00;
  Own<capnp::compiler::Compiler::Alias,_std::nullptr_t> alias;
  BuilderFor<capnp::schema::Node> builder;
  Orphan<capnp::schema::Node> schemaNode;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> subNode;
  Reader *local_538;
  size_t local_530;
  IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
  local_508;
  Fault f;
  undefined1 auStack_4f0 [64];
  Array<capnp::schema::Node::SourceInfo::Reader> aAStack_4b0 [14];
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_357;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_350;
  Fault f_1;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> local_1b0 [24];
  
  params = (Node *)CONCAT44(in_register_00000034,minimumState);
  _kjCondition.value = (bool)(params->isBuiltin ^ 1);
  if (params->isBuiltin != false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin",
               "_kjCondition,\"illegal method call for built-in declaration\"",&_kjCondition,
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal(&f);
  }
  pCVar1 = &params->guardedContent;
  SVar3 = (params->guardedContent).state;
  if (in_EDX <= (int)SVar3) {
    (this->super_Resolver)._vptr_Resolver = (_func_int **)pCVar1;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
  }
  if (params->inGetContent == true) {
    error.content.size_ = 0x2b;
    error.content.ptr = "Declaration recursively depends on itself.";
    addError(params,error);
    (this->super_Resolver)._vptr_Resolver = (_func_int **)0x0;
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
  }
  params->inGetContent = true;
  if (SVar3 != BOOTSTRAP) {
    if (SVar3 != EXPANDED) {
      if ((SVar3 != STUB) || (in_EDX < 1)) goto LAB_00352d2c;
      pIVar4 = params->module->compiler;
      Declaration::Reader::getNestedDecls((Reader *)&f,&params->declaration);
      pAVar14 = &pIVar4->nodeArena;
      builder._builder.segment = (SegmentBuilder *)&f;
      for (builder._builder.capTable._0_4_ = 0; (int)builder._builder.capTable != auStack_4f0._16_4_
          ; builder._builder.capTable._0_4_ = (int)builder._builder.capTable + 1) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
        ::operator*((Reader *)&_kjCondition,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                     *)&builder);
        if ((uint)aStack_350._24_4_ < 0x20) {
LAB_00352698:
          kj::Arena::
          allocateOwn<capnp::compiler::Compiler::Node,capnp::compiler::Compiler::Node&,capnp::compiler::Declaration::Reader&>
                    ((Arena *)&subNode,(Node *)pAVar14,(Reader *)params);
          Declaration::Reader::getName((Reader *)&f_1,(Reader *)&_kjCondition);
          AVar15 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f_1);
          kj::Vector<capnp::compiler::Compiler::Node*>::
          add<kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>&>
                    ((Vector<capnp::compiler::Compiler::Node*> *)
                     &(params->guardedContent).orderedNestedNodes,&subNode);
          local_1b0[0].disposer = subNode.disposer;
          local_1b0[0].ptr = subNode.ptr;
          subNode.ptr = (Node *)0x0;
          _f_1 = AVar15;
          std::
          _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
          ::
          _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>
                    ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node,decltype(nullptr)>>>>
                      *)&(params->guardedContent).nestedNodes,
                     (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>
                      *)&f_1);
          kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::dispose(local_1b0);
          kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::dispose(&subNode);
        }
        else {
          uVar2 = *(ushort *)(aStack_350.value.ownFile.content.size_ + 2);
          if (0xd < uVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                      (&f_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                       ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                       (char (*) [25])"unknown declaration type",(Reader *)&_kjCondition);
            kj::_::Debug::Fault::fatal(&f_1);
          }
          if ((0x35d0U >> (uVar2 & 0x1f) & 1) == 0) {
            if ((0xa2dU >> (uVar2 & 0x1f) & 1) != 0) goto LAB_00352698;
            params_1 = params->module;
            subNode.disposer = (Disposer *)CONCAT71(uStack_357,_kjCondition.value);
            subNode.ptr = (Node *)aStack_350.value.ownFile.content.ptr;
            Declaration::Using::Reader::getTarget((Reader *)&f_1,(Reader *)&subNode);
            kj::Arena::
            allocateOwn<capnp::compiler::Compiler::Alias,capnp::compiler::Compiler::CompiledModule&,capnp::compiler::Compiler::Node&,capnp::compiler::Expression::Reader>
                      ((Arena *)&alias,(CompiledModule *)pAVar14,(Node *)params_1,(Reader *)params);
            Declaration::Reader::getName((Reader *)&f_1,(Reader *)&_kjCondition);
            _f_1 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&f_1);
            local_1b0[0].disposer = alias.disposer;
            local_1b0[0].ptr = (Node *)alias.ptr;
            alias.ptr = (Alias *)0x0;
            std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
            ::
            _M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>
                      ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias,decltype(nullptr)>>>>
                        *)&(params->guardedContent).aliases,
                       (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>
                        *)&f_1);
            if (local_1b0[0].ptr != (Node *)0x0) {
              local_1b0[0].ptr = (Node *)0x0;
              (**(local_1b0[0].disposer)->_vptr_Disposer)();
            }
            if (alias.ptr != (Alias *)0x0) {
              alias.ptr = (Alias *)0x0;
              (**(alias.disposer)->_vptr_Disposer)();
            }
          }
        }
      }
      pCVar1->state = EXPANDED;
    }
    if (in_EDX < 2) goto LAB_00352d2c;
    pIVar4 = params->module->compiler;
    Orphanage::newOrphan<capnp::schema::Node>(&schemaNode,&(pIVar4->workspace).orphanage);
    capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
              (&builder,&schemaNode.builder);
    *(uint64_t *)builder._builder.data = params->id;
    capnp::schema::Node::Builder::setDisplayName(&builder,(Reader)(params->displayName).content);
    c = (char)minimumState + 'P';
    kj::StringPtr::findLast((StringPtr *)&f,c);
    if ((char)f.exception == '\x01') {
      *(uint *)((long)builder._builder.data + 8) = auStack_4f0._0_4_ + 1;
    }
    kj::StringPtr::findLast((StringPtr *)&f,c);
    if (((char)f.exception == '\x01') &&
       ((CapTableReader *)(ulong)*(uint *)((long)builder._builder.data + 8) <
        (ulong)auStack_4f0._0_8_)) {
      *(int *)((long)builder._builder.data + 8) = (int)auStack_4f0._0_8_ + 1;
    }
    pNVar10 = (params->parent).ptr;
    if (pNVar10 != (Node *)0x0) {
      *(uint64_t *)((long)builder._builder.data + 0x10) = pNVar10->id;
    }
    capnp::schema::Node::Builder::initNestedNodes
              ((Builder *)&alias,&builder,
               (uint)((ulong)((long)(params->guardedContent).orderedNestedNodes.builder.pos -
                             (long)(params->guardedContent).orderedNestedNodes.builder.ptr) >> 3));
    local_508.index = 0;
    ppNVar5 = (params->guardedContent).orderedNestedNodes.builder.pos;
    local_508.container = (Builder *)&alias;
    for (ppNVar12 = (params->guardedContent).orderedNestedNodes.builder.ptr; ppNVar12 != ppNVar5;
        ppNVar12 = ppNVar12 + 1) {
      pNVar10 = *ppNVar12;
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->((TemporaryPointer<capnp::schema::Node::NestedNode::Builder> *)&_kjCondition,
                   &local_508);
      Declaration::Reader::getName((Reader *)&f,&pNVar10->declaration);
      value = LocatedText::Reader::getValue((Reader *)&f);
      capnp::schema::Node::NestedNode::Builder::setName((Builder *)&_kjCondition,value);
      capnp::_::
      IndexingIterator<capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Builder,_capnp::schema::Node::NestedNode::Builder>
      ::operator->((TemporaryPointer<capnp::schema::Node::NestedNode::Builder> *)&f,&local_508);
      *(uint64_t *)auStack_4f0._8_8_ = pNVar10->id;
      local_508.index = local_508.index + 1;
    }
    pAVar14 = &(pIVar4->workspace).arena;
    f.exception._0_1_ = params->module->compiler->annotationFlag == COMPILE_ANNOTATIONS;
    pNVar8 = kj::Arena::
             allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                       (pAVar14,params,&params->module->parserModule->super_ErrorReporter,
                        &params->declaration,&schemaNode,(bool *)&f);
    (params->guardedContent).translator = pNVar8;
    NodeTranslator::getBootstrapNode((NodeSet *)&subNode,pNVar8);
    this_00 = &(pIVar4->workspace).bootstrapLoader;
    for (lVar11 = local_530 * 0x30; lVar11 != 0; lVar11 = lVar11 + -0x30) {
      SchemaLoader::loadOnce(this_00,local_538);
      local_538 = local_538 + 1;
    }
    SVar9 = SchemaLoader::loadOnce(this_00,(Reader *)&subNode);
    (params->guardedContent).bootstrapSchema.ptr.field_1.value.raw = SVar9.raw;
    (params->guardedContent).bootstrapSchema.ptr.isSet = true;
    pNVar10 = params;
    NodeTranslator::NodeSet::~NodeSet((NodeSet *)&subNode);
    _kjCondition.value = false;
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&f,(NullableValue<kj::Exception> *)&_kjCondition);
    kj::_::NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)&_kjCondition);
    if ((char)f.exception == '\x01') {
      if ((params->guardedContent).bootstrapSchema.ptr.isSet == true) {
        (params->guardedContent).bootstrapSchema.ptr.isSet = false;
      }
      iVar7 = (*(params->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar7 == '\0') {
        kj::str<char_const(&)[60],kj::Exception&>
                  ((String *)&_kjCondition,
                   (kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])auStack_4f0,(Exception *)pNVar10);
        if ((Node *)aStack_350.value.ownFile.content.ptr == (Node *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (char *)CONCAT71(uStack_357,_kjCondition.value);
        }
        error_00.content.size_ =
             aStack_350.value.ownFile.content.ptr +
             ((Node *)aStack_350.value.ownFile.content.ptr == (Node *)0x0);
        error_00.content.ptr = pcVar13;
        addError(params,error_00);
        kj::Array<char>::~Array((Array<char> *)&_kjCondition);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
    f.exception._0_1_ = 1;
    auStack_4f0._0_8_ = pCVar1;
    ptr = (undefined1 *)kj::Arena::allocateBytes(pAVar14,0x10,8,true);
    *ptr = 1;
    *(Content **)(ptr + 8) = pCVar1;
    f.exception = f.exception & 0xffffffffffffff00;
    kj::Arena::setDestructor
              (pAVar14,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:578:38)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:578:38)>
                 *)&f);
    pCVar1->state = BOOTSTRAP;
    capnp::_::OrphanBuilder::~OrphanBuilder(&schemaNode.builder);
  }
  if (2 < in_EDX) {
    auStack_4f0._8_8_ = (word *)0x0;
    auStack_4f0._16_4_ = 0;
    auStack_4f0._20_2_ = 0;
    auStack_4f0._22_2_ = 0;
    auStack_4f0._24_4_ = 0;
    auStack_4f0._28_2_ = 0;
    f.exception = (Exception *)0x0;
    auStack_4f0._0_8_ = (CapTableReader *)0x0;
    auStack_4f0._32_4_ = 0x7fffffff;
    auStack_4f0._40_8_ = (char *)0x0;
    auStack_4f0._48_8_ = 0;
    auStack_4f0._56_8_ = (ArrayDisposer *)0x0;
    aAStack_4b0[0].ptr = (Reader *)0x0;
    aAStack_4b0[0].size_ = 0;
    aAStack_4b0[0].disposer = (ArrayDisposer *)0x0;
    if ((params->guardedContent).bootstrapSchema.ptr.isSet == false) {
      iVar7 = (*(params->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      f_1.exception._0_1_ = (char)iVar7;
      if ((char)iVar7 == '\0') {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                   ,0x253,FAILED,"module->getErrorReporter().hadErrors()","_kjCondition,",
                   (DebugExpression<bool> *)&f_1);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      NodeTranslator::getBootstrapNode((NodeSet *)&_kjCondition,(params->guardedContent).translator)
      ;
      NodeTranslator::NodeSet::operator=((NodeSet *)&f,(NodeSet *)&_kjCondition);
    }
    else {
      pNVar8 = (params->guardedContent).translator;
      SVar9 = SchemaLoader::getUnbound
                        (&(params->module->compiler->workspace).bootstrapLoader,params->id);
      NodeTranslator::finish((NodeSet *)&_kjCondition,pNVar8,SVar9);
      NodeTranslator::NodeSet::operator=((NodeSet *)&f,(NodeSet *)&_kjCondition);
    }
    NodeTranslator::NodeSet::~NodeSet((NodeSet *)&_kjCondition);
    if ((params->guardedContent).finalSchema.ptr.isSet == true) {
      (params->guardedContent).finalSchema.ptr.isSet = false;
    }
    pMVar6 = &(params->guardedContent).finalSchema;
    *(int *)((long)&(pMVar6->ptr).field_1 + 0x20) = (int)auStack_4f0._24_6_;
    *(short *)((long)&(pMVar6->ptr).field_1 + 0x24) = SUB62(auStack_4f0._24_6_,4);
    *(undefined2 *)((long)&(pMVar6->ptr).field_1 + 0x26) = auStack_4f0._30_2_;
    *(ulong *)&(params->guardedContent).finalSchema.ptr.field_1.value._reader.nestingLimit =
         CONCAT44(auStack_4f0._36_4_,auStack_4f0._32_4_);
    (params->guardedContent).finalSchema.ptr.field_1.value._reader.data = (void *)auStack_4f0._8_8_;
    (params->guardedContent).finalSchema.ptr.field_1.value._reader.pointers =
         (WirePointer *)CONCAT26(auStack_4f0._22_2_,CONCAT24(auStack_4f0._20_2_,auStack_4f0._16_4_))
    ;
    (params->guardedContent).finalSchema.ptr.field_1.value._reader.segment =
         (SegmentReader *)f.exception;
    (params->guardedContent).finalSchema.ptr.field_1.value._reader.capTable =
         (CapTableReader *)auStack_4f0._0_8_;
    (params->guardedContent).finalSchema.ptr.isSet = true;
    kj::Array<capnp::schema::Node::Reader>::operator=
              (&(params->guardedContent).auxSchemas,
               (Array<capnp::schema::Node::Reader> *)(auStack_4f0 + 0x28));
    kj::Array<capnp::schema::Node::SourceInfo::Reader>::operator=
              (&(params->guardedContent).sourceInfo,aAStack_4b0);
    pCVar1->state = FINISHED;
    NodeTranslator::NodeSet::~NodeSet((NodeSet *)&f);
  }
LAB_00352d2c:
  (this->super_Resolver)._vptr_Resolver = (_func_int **)pCVar1;
  params->inGetContent = false;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)this;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return kj::none;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } KJ_FALLTHROUGH;

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_SOME(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(lastDot + 1);
      }
      KJ_IF_SOME(lastColon, displayName.findLast(':')) {
        if (lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(lastColon + 1);
        }
      }
      KJ_IF_SOME(p, parent) {
        builder.setScopeId(p.id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = kj::none;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = kj::none;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } KJ_FALLTHROUGH;

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      NodeTranslator::NodeSet nodeSet;
      if (content.bootstrapSchema == kj::none) {
        // Must have failed in an earlier stage.
        KJ_ASSERT(module->getErrorReporter().hadErrors());
        nodeSet = content.translator->getBootstrapNode();
      } else {
        nodeSet = content.translator->finish(
            module->getCompiler().getWorkspace().bootstrapLoader.getUnbound(id));
      }

      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } KJ_FALLTHROUGH;

    case Content::FINISHED:
      break;
  }

  return content;
}